

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

FeatureSetDefaults * __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest::ReadEditionDefaults
          (FeatureSetDefaults *__return_storage_ptr__,CommandLineInterfaceTest *this,
          string_view filename)

{
  bool bVar1;
  LogMessage *pLVar2;
  LogMessage local_a0;
  Voidify local_89;
  string_view local_88;
  size_t local_68;
  char *pcStack_60;
  undefined1 local_50 [8];
  string file_contents;
  CommandLineInterfaceTest *this_local;
  string_view filename_local;
  FeatureSetDefaults *defaults;
  
  file_contents.field_2._M_local_buf[0xf] = '\0';
  FeatureSetDefaults::FeatureSetDefaults(__return_storage_ptr__);
  local_68 = filename._M_len;
  pcStack_60 = filename._M_str;
  compiler::(anonymous_namespace)::CommandLineInterfaceTest::ReadFile_abi_cxx11_
            ((string *)local_50,this,filename);
  local_88 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
  bVar1 = protobuf::MessageLite::ParseFromString((MessageLite *)__return_storage_ptr__,local_88);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    file_contents.field_2._M_local_buf[0xf] = '\x01';
    std::__cxx11::string::~string((string *)local_50);
    if ((file_contents.field_2._M_local_buf[0xf] & 1U) == 0) {
      FeatureSetDefaults::~FeatureSetDefaults(__return_storage_ptr__);
    }
    return __return_storage_ptr__;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
             ,0x167,"defaults.ParseFromString(file_contents)");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a0);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [32])"Could not parse file contents: ");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,filename);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_89,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_a0);
}

Assistant:

FeatureSetDefaults CommandLineInterfaceTest::ReadEditionDefaults(
    absl::string_view filename) {
  FeatureSetDefaults defaults;
  std::string file_contents = ReadFile(filename);
  ABSL_CHECK(defaults.ParseFromString(file_contents))
      << "Could not parse file contents: " << filename;
  return defaults;
}